

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

void __thiscall duckdb::ColumnReader::~ColumnReader(ColumnReader *this)

{
  void *in_RDI;
  ColumnReader *unaff_retaddr;
  
  ~ColumnReader(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

ColumnReader::~ColumnReader() {
}